

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  stbi_uc sVar3;
  char cVar4;
  bool bVar5;
  long lVar6;
  uint x;
  uint uVar7;
  stbi_uc *psVar8;
  stbi_uc *psVar9;
  uint uVar10;
  long lVar11;
  byte bVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  byte *pbVar16;
  uint uVar17;
  uchar *puVar18;
  uchar *puVar19;
  byte bVar20;
  int iVar21;
  int *piVar22;
  byte bVar23;
  int left;
  uint *puVar24;
  stbi_uc value [4];
  stbi__pic_packet packets [10];
  stbi_uc local_a8 [4];
  uint local_a4;
  uchar *local_a0;
  uint *local_98;
  int *local_90;
  long local_88;
  int local_80;
  int local_7c;
  ulong local_78;
  ulong local_70;
  long local_68;
  uint *local_60;
  char local_57 [39];
  
  psVar1 = s->buffer_start;
  psVar2 = s->buffer_start + 1;
  psVar9 = s->img_buffer;
  psVar8 = s->img_buffer_end;
  iVar14 = 0x5c;
  local_60 = (uint *)px;
  do {
    if (psVar9 < psVar8) {
      psVar9 = psVar9 + 1;
LAB_00118de1:
      s->img_buffer = psVar9;
    }
    else if (s->read_from_callbacks != 0) {
      iVar21 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
      if (iVar21 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        psVar8 = psVar2;
      }
      else {
        psVar8 = psVar1 + iVar21;
      }
      s->img_buffer_end = psVar8;
      psVar9 = psVar2;
      goto LAB_00118de1;
    }
    iVar14 = iVar14 + -1;
  } while (iVar14 != 0);
  x = stbi__get16be(s);
  uVar7 = stbi__get16be(s);
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00118e40:
    if (s->img_buffer_end <= s->img_buffer) {
LAB_00118e78:
      stbi__g_failure_reason = "bad file";
      return (stbi_uc *)0x0;
    }
  }
  else {
    iVar14 = (*(s->io).eof)(s->io_user_data);
    if (iVar14 != 0) {
      if (s->read_from_callbacks == 0) goto LAB_00118e78;
      goto LAB_00118e40;
    }
  }
  bVar20 = 0;
  if ((uint)(0x10000000 / (ulong)x) < uVar7) {
    stbi__g_failure_reason = "too large";
    return (stbi_uc *)0x0;
  }
  local_98 = (uint *)py;
  local_90 = comp;
  stbi__get16be(s);
  stbi__get16be(s);
  stbi__get16be(s);
  stbi__get16be(s);
  local_7c = x * 4;
  uVar15 = local_7c * uVar7;
  local_a4 = uVar7;
  local_a0 = (uchar *)malloc((ulong)uVar15);
  memset(local_a0,0xff,(ulong)uVar15);
  pbVar16 = (byte *)(local_57 + 1);
  lVar11 = 0;
LAB_00118ee8:
  if (lVar11 == 10) goto LAB_001194a8;
  psVar9 = s->img_buffer;
  psVar8 = s->img_buffer_end;
  local_88 = lVar11;
  if (psVar9 < psVar8) {
    s->img_buffer = psVar9 + 1;
    sVar3 = *psVar9;
    psVar9 = psVar9 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    sVar3 = '\0';
  }
  else {
    iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
    if (iVar14 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      sVar3 = '\0';
      psVar8 = psVar2;
    }
    else {
      sVar3 = *psVar1;
      psVar8 = psVar1 + iVar14;
    }
    s->img_buffer_end = psVar8;
    s->img_buffer = psVar2;
    psVar9 = psVar2;
  }
  if (psVar9 < psVar8) {
    s->img_buffer = psVar9 + 1;
    bVar23 = *psVar9;
    psVar9 = psVar9 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    bVar23 = 0;
  }
  else {
    iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
    if (iVar14 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      bVar23 = 0;
      psVar8 = psVar2;
    }
    else {
      bVar23 = *psVar1;
      psVar8 = psVar1 + iVar14;
    }
    s->img_buffer_end = psVar8;
    s->img_buffer = psVar2;
    psVar9 = psVar2;
  }
  pbVar16[-2] = bVar23;
  if (psVar9 < psVar8) {
    s->img_buffer = psVar9 + 1;
    bVar12 = *psVar9;
    psVar9 = psVar9 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    bVar12 = 0;
  }
  else {
    iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
    if (iVar14 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      bVar12 = 0;
      psVar8 = psVar2;
    }
    else {
      bVar12 = *psVar1;
      psVar8 = psVar1 + iVar14;
    }
    s->img_buffer_end = psVar8;
    s->img_buffer = psVar2;
    psVar9 = psVar2;
  }
  pbVar16[-1] = bVar12;
  if (psVar9 < psVar8) {
    s->img_buffer = psVar9 + 1;
    bVar12 = *psVar9;
    psVar9 = psVar9 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    bVar12 = 0;
  }
  else {
    iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
    if (iVar14 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      bVar12 = 0;
      psVar8 = psVar2;
    }
    else {
      bVar12 = *psVar1;
      psVar8 = psVar1 + iVar14;
    }
    s->img_buffer_end = psVar8;
    s->img_buffer = psVar2;
    psVar9 = psVar2;
  }
  *pbVar16 = bVar12;
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001190f3:
    if (psVar8 <= psVar9) goto LAB_001194b1;
LAB_001190fc:
    if (bVar23 != 8) goto LAB_001194a8;
    bVar20 = bVar20 | bVar12;
    pbVar16 = pbVar16 + 3;
    lVar11 = local_88 + 1;
    if (sVar3 == '\0') goto code_r0x00119124;
    goto LAB_00118ee8;
  }
  iVar14 = (*(s->io).eof)(s->io_user_data);
  if (iVar14 == 0) goto LAB_001190fc;
  if (s->read_from_callbacks != 0) {
    psVar9 = s->img_buffer;
    psVar8 = s->img_buffer_end;
    goto LAB_001190f3;
  }
LAB_001194b1:
  stbi__g_failure_reason = "bad file";
LAB_001194d2:
  piVar22 = local_90;
  puVar24 = local_98;
  free(local_a0);
  puVar18 = (uchar *)0x0;
LAB_001194d9:
  *local_60 = x;
  *puVar24 = local_a4;
  if (req_comp == 0) {
    req_comp = *piVar22;
  }
  puVar18 = stbi__convert_format(puVar18,4,req_comp,x,local_a4);
  return puVar18;
code_r0x00119124:
  *local_90 = 4 - (uint)((bVar20 & 0x10) == 0);
  if (local_a4 != 0) {
    local_78 = (ulong)local_a4;
    uVar13 = 0;
    local_88 = lVar11;
    do {
      puVar18 = local_a0 + local_7c * (int)uVar13;
      lVar11 = 0;
      local_70 = uVar13;
      do {
        lVar6 = lVar11 * 3;
        cVar4 = local_57[lVar6];
        local_68 = lVar11;
        if (cVar4 == '\0') {
          bVar20 = local_57[lVar6 + 1];
          puVar19 = puVar18;
          uVar7 = x;
          do {
            psVar9 = stbi__readval(s,(uint)bVar20,puVar19);
            if (psVar9 == (stbi_uc *)0x0) goto LAB_001194d2;
            puVar19 = puVar19 + 4;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
        else {
          puVar19 = puVar18;
          uVar7 = x;
          if (cVar4 == '\x01') {
            do {
              psVar9 = s->img_buffer;
              psVar8 = s->img_buffer_end;
              if (psVar9 < psVar8) {
                s->img_buffer = psVar9 + 1;
                bVar20 = *psVar9;
                psVar9 = psVar9 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                bVar20 = 0;
              }
              else {
                iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                if (iVar14 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar20 = 0;
                  psVar8 = psVar2;
                }
                else {
                  bVar20 = *psVar1;
                  psVar8 = psVar1 + iVar14;
                }
                s->img_buffer_end = psVar8;
                s->img_buffer = psVar2;
                psVar9 = psVar2;
              }
              if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001193cd:
                if (psVar8 <= psVar9) goto LAB_001194b1;
              }
              else {
                iVar14 = (*(s->io).eof)(s->io_user_data);
                if (iVar14 != 0) {
                  if (s->read_from_callbacks != 0) {
                    psVar9 = s->img_buffer;
                    psVar8 = s->img_buffer_end;
                    goto LAB_001193cd;
                  }
                  goto LAB_001194b1;
                }
              }
              psVar9 = stbi__readval(s,(uint)(byte)local_57[lVar6 + 1],local_a8);
              if (psVar9 == (stbi_uc *)0x0) goto LAB_001194d2;
              if (uVar7 < bVar20) {
                bVar20 = (byte)uVar7;
              }
              uVar15 = (uint)bVar20;
              if (bVar20 != 0) {
                uVar10 = 0;
                do {
                  bVar20 = local_57[lVar6 + 1];
                  uVar17 = 0x80;
                  lVar11 = 0;
                  do {
                    if ((uVar17 & bVar20) != 0) {
                      puVar19[lVar11] = local_a8[lVar11];
                    }
                    lVar11 = lVar11 + 1;
                    uVar17 = uVar17 >> 1;
                  } while (lVar11 != 4);
                  uVar10 = uVar10 + 1;
                  puVar19 = puVar19 + 4;
                } while (uVar10 != uVar15);
              }
              uVar10 = uVar7 - uVar15;
              bVar5 = (int)uVar15 <= (int)uVar7;
              uVar7 = uVar10;
            } while (uVar10 != 0 && bVar5);
          }
          else {
            if (cVar4 != '\x02') goto LAB_001194a8;
            do {
              psVar9 = s->img_buffer;
              psVar8 = s->img_buffer_end;
              if (psVar9 < psVar8) {
                s->img_buffer = psVar9 + 1;
                bVar20 = *psVar9;
                psVar9 = psVar9 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                bVar20 = 0;
              }
              else {
                iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                if (iVar14 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar20 = 0;
                  psVar8 = psVar2;
                }
                else {
                  bVar20 = *psVar1;
                  psVar8 = psVar1 + iVar14;
                }
                s->img_buffer_end = psVar8;
                s->img_buffer = psVar2;
                psVar9 = psVar2;
              }
              if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0011925d:
                if (psVar8 <= psVar9) goto LAB_001194b1;
              }
              else {
                iVar14 = (*(s->io).eof)(s->io_user_data);
                if (iVar14 != 0) {
                  if (s->read_from_callbacks != 0) {
                    psVar9 = s->img_buffer;
                    psVar8 = s->img_buffer_end;
                    goto LAB_0011925d;
                  }
                  goto LAB_001194b1;
                }
              }
              uVar15 = (uint)bVar20;
              if ((char)bVar20 < '\0') {
                if (uVar15 == 0x80) {
                  iVar14 = stbi__get16be(s);
                }
                else {
                  iVar14 = uVar15 - 0x7f;
                }
                if ((int)uVar7 < iVar14) goto LAB_001194b1;
                psVar9 = stbi__readval(s,(uint)(byte)local_57[lVar6 + 1],local_a8);
                if (psVar9 == (stbi_uc *)0x0) goto LAB_001194d2;
                if (0 < iVar14) {
                  iVar21 = 0;
                  do {
                    bVar20 = local_57[lVar6 + 1];
                    uVar15 = 0x80;
                    lVar11 = 0;
                    do {
                      if ((uVar15 & bVar20) != 0) {
                        puVar19[lVar11] = local_a8[lVar11];
                      }
                      lVar11 = lVar11 + 1;
                      uVar15 = uVar15 >> 1;
                    } while (lVar11 != 4);
                    iVar21 = iVar21 + 1;
                    puVar19 = puVar19 + 4;
                  } while (iVar21 != iVar14);
                }
              }
              else {
                iVar21 = bVar20 + 1;
                local_80 = iVar21;
                if (uVar7 <= uVar15) goto LAB_001194b1;
                do {
                  psVar9 = stbi__readval(s,(uint)(byte)local_57[lVar6 + 1],puVar19);
                  if (psVar9 == (stbi_uc *)0x0) goto LAB_001194d2;
                  puVar19 = puVar19 + 4;
                  iVar21 = iVar21 + -1;
                  iVar14 = local_80;
                } while (iVar21 != 0);
              }
              uVar15 = uVar7 - iVar14;
              bVar5 = iVar14 <= (int)uVar7;
              uVar7 = uVar15;
            } while (uVar15 != 0 && bVar5);
          }
        }
        lVar11 = local_68 + 1;
      } while (local_88 != lVar11);
      uVar13 = local_70 + 1;
    } while (uVar13 != local_78);
  }
  puVar18 = local_a0;
  piVar22 = local_90;
  puVar24 = local_98;
  if (local_a0 != (uchar *)0x0) goto LAB_001194d9;
  goto LAB_001194d2;
LAB_001194a8:
  stbi__g_failure_reason = "bad format";
  goto LAB_001194d2;
}

Assistant:

static stbi_uc *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp)
{
   stbi_uc *result;
   int i, x,y;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);
   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if ((1 << 28) / x < y) return stbi__errpuc("too large", "Image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc(x*y*4);
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}